

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utmpset.c
# Opt level: O2

int main(int argc,char **argv,char **envp)

{
  int iVar1;
  char *line;
  bool bVar2;
  long lVar3;
  
  progname = *argv;
  bVar2 = true;
LAB_00102528:
  do {
    iVar1 = sgetoptmine(argc,argv,"wV");
    if (iVar1 == subgetoptdone) {
      lVar3 = (long)subgetoptind;
      line = argv[lVar3];
      if (line == (char *)0x0) {
        usage();
        line = argv[lVar3];
      }
      iVar1 = utmp_logout(line);
      if (iVar1 == -1) {
        strerr_die(0x6f,"utmpset: warning: ","unable to logout line ",argv[lVar3],
                   " in utmp: no such entry",(char *)0x0,(char *)0x0,(strerr *)0x0);
      }
      if (!bVar2) {
        iVar1 = wtmp_logout(argv[lVar3]);
        if (iVar1 == -1) {
          strerr_die(0x6f,"utmpset: warning: ","unable to logout line ",argv[lVar3]," in wtmp: ",
                     (char *)0x0,(char *)0x0,&strerr_sys);
        }
      }
      _exit(0);
    }
    if (iVar1 != 0x3f) {
      if (iVar1 != 0x56) {
        if (iVar1 == 0x77) {
          bVar2 = false;
        }
        goto LAB_00102528;
      }
      strerr_warn("2.1.3",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0,(strerr *)0x0)
      ;
    }
    usage();
  } while( true );
}

Assistant:

int main (int argc, const char * const *argv, const char * const *envp) {
  int opt;
  int wtmp =0;

  progname =*argv;

  while ((opt =getopt(argc, argv, "wV")) != opteof) {
    switch(opt) {
    case 'w':
      wtmp =1;
      break;
    case 'V':
      strerr_warn1(VERSION, 0);
    case '?':
      usage();
    }
  }
  argv +=optind;

  if (! argv || ! *argv) usage();
  if (utmp_logout(*argv) == -1)
    strerr_die4x(111, WARNING, "unable to logout line ", *argv,
                 " in utmp: no such entry");
  if (wtmp)
    if (wtmp_logout(*argv) == -1)
      strerr_die4sys(111, WARNING,
                     "unable to logout line ", *argv, " in wtmp: ");
  _exit(0);
}